

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O2

vboolf_impl<4> __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::eval_general(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
               *this,vboolf_impl<4> *valid,SubdividedGeneralPatch *patch,vfloat_impl<4> *U,
              vfloat_impl<4> *V,size_t depth)

{
  int i_00;
  long lVar1;
  uint uVar2;
  size_t *extraout_RAX;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar11 [16];
  int iVar18;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar19 [16];
  vboolf_impl<4> vVar23;
  vint_impl<4> i;
  vboolf_impl<4> valid2;
  vfloat_impl<4> v;
  vfloat_impl<4> u;
  int local_b8 [4];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_a8;
  SubdividedGeneralPatch *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  anon_class_48_6_b83c5ffe local_60;
  size_t *psVar3;
  
  uVar4 = mm_lookupmask_ps._8_8_;
  this->P = (float *)mm_lookupmask_ps._0_8_;
  this->dPdu = (float *)uVar4;
  fVar5 = (V->field_0).v[0] * 0.5;
  fVar12 = (V->field_0).v[1] * 0.5;
  fVar14 = (V->field_0).v[2] * 0.5;
  fVar16 = (V->field_0).v[3] * 0.5;
  local_90 = (SubdividedGeneralPatch *)U;
  fVar6 = floorf(fVar14);
  fVar7 = floorf(fVar16);
  fVar8 = floorf(fVar5);
  fVar9 = floorf(fVar12);
  fVar5 = fVar5 - fVar8;
  fVar12 = fVar12 - fVar9;
  fVar14 = fVar14 - fVar6;
  fVar16 = fVar16 - fVar7;
  local_78 = fVar5 + fVar5 + -0.5;
  fStack_74 = fVar12 + fVar12 + -0.5;
  fStack_70 = fVar14 + fVar14 + -0.5;
  fStack_6c = fVar16 + fVar16 + -0.5;
  fVar5 = *(float *)depth;
  fVar13 = *(float *)(depth + 4) * 0.5;
  fVar15 = *(float *)(depth + 8) * 0.5;
  fVar17 = *(float *)(depth + 0xc) * 0.5;
  fVar12 = floorf(fVar15);
  fVar14 = floorf(fVar17);
  fVar16 = floorf(fVar5 * 0.5);
  fVar10 = floorf(fVar13);
  fVar5 = fVar5 * 0.5 - fVar16;
  fVar13 = fVar13 - fVar10;
  fVar15 = fVar15 - fVar12;
  fVar17 = fVar17 - fVar14;
  local_88 = fVar5 + fVar5 + -0.5;
  fStack_84 = fVar13 + fVar13 + -0.5;
  fStack_80 = fVar15 + fVar15 + -0.5;
  fStack_7c = fVar17 + fVar17 + -0.5;
  iVar18 = (int)fVar16 * 4 + (int)fVar8;
  iVar20 = (int)fVar10 * 4 + (int)fVar9;
  iVar21 = (int)fVar12 * 4 + (int)fVar6;
  iVar22 = (int)fVar14 * 4 + (int)fVar7;
  local_b8[0] = iVar18;
  local_b8[1] = iVar20;
  local_b8[2] = iVar21;
  local_b8[3] = iVar22;
  local_60.ret = (vboolf_impl<4> *)this;
  local_60.this =
       (PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
        *)valid;
  local_60.patch = &local_90;
  local_60.u = (vfloat_impl<4> *)&local_78;
  local_60.v = (vfloat_impl<4> *)&local_88;
  psVar3 = (size_t *)&stack0x00000008;
  local_60.depth = psVar3;
  auVar19._0_4_ = patch->N;
  auVar19._4_4_ = *(undefined4 *)&patch->field_0x4;
  auVar19._8_8_ = patch->child[0];
  uVar4 = extraout_RDX;
  while (uVar2 = movmskps((int)psVar3,auVar19), uVar2 != 0) {
    lVar1 = 0;
    if ((uVar2 & 0xff) != 0) {
      for (; ((uVar2 & 0xff) >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    i_00 = local_b8[(int)lVar1];
    auVar11._0_4_ = -(uint)(i_00 == iVar18);
    auVar11._4_4_ = -(uint)(i_00 == iVar20);
    auVar11._8_4_ = -(uint)(i_00 == iVar21);
    auVar11._12_4_ = -(uint)(i_00 == iVar22);
    local_a8 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar11 & auVar19);
    auVar19 = auVar19 ^ (undefined1  [16])local_a8;
    eval_general::anon_class_48_6_b83c5ffe::operator()(&local_60,(vboolf_impl<4> *)&local_a8,i_00);
    psVar3 = extraout_RAX;
    uVar4 = extraout_RDX_00;
  }
  vVar23.field_0._8_8_ = uVar4;
  vVar23.field_0._0_8_ = this;
  return (vboolf_impl<4>)vVar23.field_0;
}

Assistant:

vbool eval_general(const vbool& valid, const typename Patch::SubdividedGeneralPatch* patch, const vfloat& U, const vfloat& V, const size_t depth)
        {
          vbool ret = false;
          const vint l = (vint)floor(0.5f*U); const vfloat u = 2.0f*frac(0.5f*U)-0.5f; 
          const vint h = (vint)floor(0.5f*V); const vfloat v = 2.0f*frac(0.5f*V)-0.5f; 
          const vint i = (h<<2)+l; assert(all(valid,i<patch->N));
          foreach_unique(valid,i,[&](const vbool& valid, const int i) {
              ret |= eval(valid,patch->child[i],u,v,1.0f,depth+1);
            });
          return ret;
        }